

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall am_CList::Add_Update(am_CList *this,CItem *item)

{
  CItem *pCVar1;
  CItem *pCVar2;
  CItem *pCVar3;
  
  if (item == (CItem *)0x0) {
    return;
  }
  if (this->head != (CItem *)0x0) {
    pCVar1 = (CItem *)0x0;
    pCVar2 = this->head;
    do {
      if (pCVar2 == item) {
        pCVar3 = (pCVar2->field_1).prev;
        if (pCVar1 == (CItem *)0x0) {
          this->head = pCVar3;
        }
        else {
          (pCVar1->field_1).prev = pCVar3;
        }
      }
      else {
        pCVar3 = (pCVar2->field_1).prev;
      }
      pCVar1 = pCVar2;
      pCVar2 = pCVar3;
    } while (pCVar3 != (CItem *)0x0);
    if (this->head != (CItem *)0x0) {
      item->field_1 = this->head->field_1;
      this = (am_CList *)&this->head->field_1;
      goto LAB_001cc708;
    }
  }
  (item->field_1).prev = (CItem *)0x0;
LAB_001cc708:
  *this = (am_CList)item;
  return;
}

Assistant:

void
am_CList::Add_Update(CItem *item)
{
  if (item) {
    Remove_Inv(item);
    if (head) {
      item->next_invalid = head->next_invalid;
      head->next_invalid = item;
    } else {
      item->next_invalid = head;
      head = item;
    }
  }
}